

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcDebugEnumStackFrame(uint frame)

{
  undefined4 local_10;
  uint address;
  uint frame_local;
  
  local_10 = 0;
  if (NULLC::currExec == 1) {
    local_10 = ExecutorX86::GetCallStackAddress(NULLC::executorX86,frame);
  }
  else if (NULLC::currExec == 0) {
    local_10 = ExecutorRegVm::GetCallStackAddress(NULLC::executorRegVm,frame);
  }
  return local_10;
}

Assistant:

unsigned int nullcDebugEnumStackFrame(unsigned frame)
{
	using namespace NULLC;

	unsigned address = 0;

	// Get next address from call stack
	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		address = executorX86->GetCallStackAddress(frame);
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
#ifndef NULLC_NO_EXECUTOR
		address = executorRegVm->GetCallStackAddress(frame);
#endif
	}

	(void)frame;

	return address;
}